

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cwd-and-chdir.c
# Opt level: O3

int run_test_cwd_and_chdir(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  size_t size1;
  size_t size2;
  char buffer_orig [1024];
  char buffer_new [1024];
  uv_timer_t uStack_8b8;
  size_t local_818;
  size_t local_810;
  uv_loop_t local_808;
  uv_loop_t local_408;
  
  local_818 = 1;
  puVar2 = &local_808;
  iVar1 = uv_cwd((char *)puVar2,&local_818);
  if (iVar1 == -0x69) {
    if (local_818 < (__pthread_internal_list *)0x2) goto LAB_0014b1fe;
    local_818 = 0x400;
    puVar2 = &local_808;
    iVar1 = uv_cwd((char *)puVar2,&local_818);
    if (iVar1 != 0) goto LAB_0014b203;
    if ((__pthread_internal_list *)local_818 == (__pthread_internal_list *)0x0) goto LAB_0014b208;
    if (*(char *)((long)local_808.handle_queue + (long)(local_818 + -0x10)) == '/')
    goto LAB_0014b20d;
    puVar2 = &local_808;
    iVar1 = uv_chdir((char *)puVar2);
    if (iVar1 != 0) goto LAB_0014b212;
    local_810 = 0x400;
    puVar2 = &local_408;
    iVar1 = uv_cwd((char *)puVar2,&local_810);
    if (iVar1 != 0) goto LAB_0014b217;
    if (local_818 != local_810) goto LAB_0014b21c;
    puVar2 = &local_808;
    iVar1 = strcmp((char *)puVar2,(char *)&local_408);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_cwd_and_chdir_cold_1();
LAB_0014b1fe:
    run_test_cwd_and_chdir_cold_2();
LAB_0014b203:
    run_test_cwd_and_chdir_cold_3();
LAB_0014b208:
    run_test_cwd_and_chdir_cold_9();
LAB_0014b20d:
    run_test_cwd_and_chdir_cold_8();
LAB_0014b212:
    run_test_cwd_and_chdir_cold_4();
LAB_0014b217:
    run_test_cwd_and_chdir_cold_5();
LAB_0014b21c:
    run_test_cwd_and_chdir_cold_6();
  }
  run_test_cwd_and_chdir_cold_7();
  loop = uv_default_loop();
  if (loop == (uv_loop_t *)0x0) {
    run_test_default_loop_close_cold_13();
LAB_0014b356:
    run_test_default_loop_close_cold_1();
LAB_0014b35b:
    run_test_default_loop_close_cold_2();
LAB_0014b360:
    run_test_default_loop_close_cold_3();
LAB_0014b365:
    loop = puVar2;
    run_test_default_loop_close_cold_4();
LAB_0014b36a:
    run_test_default_loop_close_cold_5();
LAB_0014b36f:
    run_test_default_loop_close_cold_12();
LAB_0014b374:
    run_test_default_loop_close_cold_6();
LAB_0014b379:
    run_test_default_loop_close_cold_7();
LAB_0014b37e:
    run_test_default_loop_close_cold_8();
LAB_0014b383:
    puVar2 = loop;
    run_test_default_loop_close_cold_9();
  }
  else {
    puVar2 = loop;
    iVar1 = uv_timer_init(loop,&uStack_8b8);
    if (iVar1 != 0) goto LAB_0014b356;
    puVar2 = (uv_loop_t *)&uStack_8b8;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014b35b;
    puVar2 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0014b360;
    if (timer_cb_called != 1) goto LAB_0014b365;
    iVar1 = uv_loop_close(loop);
    if (iVar1 != 0) goto LAB_0014b36a;
    puVar2 = uv_default_loop();
    if (puVar2 == (uv_loop_t *)0x0) goto LAB_0014b36f;
    loop = puVar2;
    iVar1 = uv_timer_init(puVar2,&uStack_8b8);
    if (iVar1 != 0) goto LAB_0014b374;
    loop = (uv_loop_t *)&uStack_8b8;
    iVar1 = uv_timer_start((uv_timer_t *)loop,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014b379;
    loop = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0014b37e;
    if (timer_cb_called != 2) goto LAB_0014b383;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014b38d;
    }
  }
  run_test_default_loop_close_cold_10();
LAB_0014b38d:
  run_test_default_loop_close_cold_11();
  timer_cb_called = timer_cb_called + 1;
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(cwd_and_chdir) {
  char buffer_orig[PATHMAX];
  char buffer_new[PATHMAX];
  size_t size1;
  size_t size2;
  int err;

  size1 = 1;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == UV_ENOBUFS);
  ASSERT(size1 > 1);

  size1 = sizeof buffer_orig;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == 0);
  ASSERT(size1 > 0);
  ASSERT(buffer_orig[size1] != '/');

  err = uv_chdir(buffer_orig);
  ASSERT(err == 0);

  size2 = sizeof buffer_new;
  err = uv_cwd(buffer_new, &size2);
  ASSERT(err == 0);

  ASSERT(size1 == size2);
  ASSERT(strcmp(buffer_orig, buffer_new) == 0);

  return 0;
}